

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTDMT_compress_advanced
                 (ZSTDMT_CCtx *mtctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,
                 ZSTD_CDict *cdict,ZSTD_parameters params,int overlapLog)

{
  ZSTD_CCtx_params params_00;
  ZSTD_parameters ZVar1;
  void *cdict_00;
  size_t sVar2;
  bool local_159;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  void *pvStack_d0;
  undefined1 local_c8 [4];
  undefined1 auStack_c4 [4];
  ZSTD_CCtx_params cctxParams;
  ZSTD_CDict *cdict_local;
  size_t srcSize_local;
  void *src_local;
  size_t dstCapacity_local;
  void *dst_local;
  ZSTDMT_CCtx *mtctx_local;
  
  ZVar1 = params;
  cctxParams.customMem.opaque = cdict;
  memcpy(local_c8,&mtctx->params,0x90);
  cdict_00 = cctxParams.customMem.opaque;
  auStack_c4 = params.cParams.windowLog;
  unique0x00012004 = params.cParams.chainLog;
  params.cParams._8_8_ = ZVar1.cParams._8_8_;
  cctxParams.cParams.windowLog = params.cParams.hashLog;
  cctxParams.cParams.chainLog = params.cParams.searchLog;
  params.cParams._16_8_ = ZVar1.cParams._16_8_;
  cctxParams.cParams.hashLog = params.cParams.minMatch;
  cctxParams.cParams.searchLog = params.cParams.targetLength;
  params.cParams.strategy = ZVar1.cParams.strategy;
  cctxParams.cParams.minMatch = params.cParams.strategy;
  params.fParams._0_8_ = ZVar1.fParams._0_8_;
  cctxParams.cParams.targetLength = params.fParams.contentSizeFlag;
  cctxParams.cParams.strategy = params.fParams.checksumFlag;
  params.fParams.noDictIDFlag = ZVar1.fParams.noDictIDFlag;
  cctxParams.fParams.contentSizeFlag = params.fParams.noDictIDFlag;
  local_159 = 9 < (uint)overlapLog;
  if (local_159) {
    __assert_fail("ZSTD_OVERLAPLOG_MIN <= overlapLog && overlapLog <= ZSTD_OVERLAPLOG_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4fbd,
                  "size_t ZSTDMT_compress_advanced(ZSTDMT_CCtx *, void *, size_t, const void *, size_t, const ZSTD_CDict *, ZSTD_parameters, int)"
                 );
  }
  cctxParams.jobSize._0_4_ = overlapLog;
  memcpy(&local_158,local_c8,0x90);
  params_00.cParams.chainLog = (undefined4)uStack_150;
  params_00.cParams.hashLog = uStack_150._4_4_;
  params_00.format = (undefined4)local_158;
  params_00.cParams.windowLog = local_158._4_4_;
  params_00.cParams.searchLog = (undefined4)uStack_148;
  params_00.cParams.minMatch = uStack_148._4_4_;
  params_00.cParams.targetLength = (undefined4)uStack_140;
  params_00.cParams.strategy = uStack_140._4_4_;
  params_00.fParams.contentSizeFlag = (undefined4)local_138;
  params_00.fParams.checksumFlag = local_138._4_4_;
  params_00.fParams.noDictIDFlag = (undefined4)uStack_130;
  params_00.compressionLevel = uStack_130._4_4_;
  params_00._48_8_ = uStack_128;
  params_00.targetCBlockSize = uStack_120;
  params_00.srcSizeHint = (undefined4)local_118;
  params_00.attachDictPref = local_118._4_4_;
  params_00.literalCompressionMode = (undefined4)uStack_110;
  params_00.nbWorkers = uStack_110._4_4_;
  params_00.jobSize = uStack_108;
  params_00.overlapLog = (undefined4)uStack_100;
  params_00.rsyncable = uStack_100._4_4_;
  params_00.ldmParams.enableLdm = (undefined4)uStack_f8;
  params_00.ldmParams.hashLog = uStack_f8._4_4_;
  params_00.ldmParams.bucketSizeLog = (undefined4)uStack_f0;
  params_00.ldmParams.minMatchLength = uStack_f0._4_4_;
  params_00.ldmParams.hashRateLog = (undefined4)local_e8;
  params_00.ldmParams.windowLog = local_e8._4_4_;
  params_00.customMem.customAlloc = (ZSTD_allocFunction)uStack_e0;
  params_00.customMem.customFree = (ZSTD_freeFunction)uStack_d8;
  params_00.customMem.opaque = pvStack_d0;
  sVar2 = ZSTDMT_compress_advanced_internal
                    (mtctx,dst,dstCapacity,src,srcSize,(ZSTD_CDict *)cdict_00,params_00);
  return sVar2;
}

Assistant:

size_t ZSTDMT_compress_advanced(ZSTDMT_CCtx* mtctx,
                                void* dst, size_t dstCapacity,
                          const void* src, size_t srcSize,
                          const ZSTD_CDict* cdict,
                                ZSTD_parameters params,
                                int overlapLog)
{
    ZSTD_CCtx_params cctxParams = mtctx->params;
    cctxParams.cParams = params.cParams;
    cctxParams.fParams = params.fParams;
    assert(ZSTD_OVERLAPLOG_MIN <= overlapLog && overlapLog <= ZSTD_OVERLAPLOG_MAX);
    cctxParams.overlapLog = overlapLog;
    return ZSTDMT_compress_advanced_internal(mtctx,
                                             dst, dstCapacity,
                                             src, srcSize,
                                             cdict, cctxParams);
}